

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
               (void)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Column_settings *pCVar13;
  ulong uVar14;
  int local_8cc;
  undefined8 local_8c8;
  undefined4 *local_8c0;
  undefined4 ****local_8b8;
  char *local_8b0;
  shared_count sStack_8a8;
  undefined8 *local_8a0;
  undefined4 local_894;
  undefined **local_890;
  char *local_888;
  undefined8 *local_880;
  undefined4 **local_878;
  undefined4 **local_870;
  char *local_868;
  undefined8 local_860;
  char *local_858;
  shared_count sStack_850;
  undefined4 ***local_848;
  ulong local_840;
  shared_count sStack_838;
  char *local_830;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
  local_828;
  undefined1 local_738 [8];
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
  CStack_730;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
  mc1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
  mr;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
  mc2;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>>
            ();
  CStack_730.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_738 = (undefined1  [8])birth_comp;
  CStack_730.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  CStack_730.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  m.colSettings_ = (Column_settings *)operator_new(0x38);
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  ((m.colSettings_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
              *)&m.matrix_,m.colSettings_,(function<bool_(unsigned_int,_unsigned_int)> *)local_738,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  if (mr.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mr,&mr,3);
  }
  if ((_Manager_type)
      CStack_730.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Manager_type)0x0) {
    (*(code *)CStack_730.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)
              ((_Any_data *)local_738,(_Any_data *)local_738,__destroy_functor);
  }
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x15f);
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x209297;
  local_8b8 = &local_848;
  local_848 = (undefined4 ***)CONCAT44(local_848._4_4_,(int)m.matrix_.matrix_._M_h._M_element_count)
  ;
  local_890 = (undefined **)&local_860;
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT71(mc2.colSettings_._1_7_,(int)m.matrix_.matrix_._M_h._M_element_count == 0);
  local_860 = (char *)((ulong)local_860._4_4_ << 0x20);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_828.colSettings_ = (Column_settings *)0x209319;
  local_828.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x20938c;
  CStack_730.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_8b8;
  CStack_730.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)CStack_730.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_738 = (undefined1  [8])&PTR__lazy_ostream_0024fe50;
  CStack_730.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_890;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data + 8));
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                ::_M_invoke;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::
                       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                       ::_M_manager;
  local_738 = (undefined1  [8])operator_new(0x38);
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_738)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
  ::
  Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
              *)(local_738 + 8),&ordered_boundaries,(Column_settings *)local_738,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1);
  if (mc1.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mc1,&mc1,3);
  }
  if (mr.matrix_.super_Matrix_dimension_option.dimensions_.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    (*(code *)mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish)(&mr,&mr,3);
  }
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x163);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x209297;
  local_848 = &local_870;
  local_870._0_4_ = 7;
  local_828.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_828.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8b8 = (undefined4 ****)0x209319;
  local_8b0 = "";
  local_890 = (undefined **)&local_860;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fe50;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_848;
  mr.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&local_890;
  local_828.colSettings_._0_1_ = (int)CStack_730.matrix_._M_h._M_element_count == 7;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8));
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x164);
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
  mc2.matrix_.super_Matrix_dimension_option.dimensions_.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x209297;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = CStack_730.matrix_._M_h._M_bucket_count;
  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar3,0);
  if (CStack_730.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var2 = CStack_730.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
    do {
      if (uVar1 == 2) {
        local_860._0_4_ = *(uint *)&p_Var2[2]._M_nxt;
        local_870._0_4_ = 0;
        local_828.colSettings_._0_1_ = (uint)local_860 == 0;
        local_828.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_828.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8b8 = (undefined4 ****)0x209319;
        local_8b0 = "";
        local_890 = (undefined **)&local_860;
        mr.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
        mr.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
        local_848 = &local_870;
        mc1.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
        mc1.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
        mc1.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_848;
        mr.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_890;
        boost::test_tools::tt_detail::report_assertion
                  (&local_828,&mc2,&local_8b8,0x164,1,2,2,"mb.get_column_dimension(2)",&mr,"0",&mc1)
        ;
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   ((long)&local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
                   8));
        local_188 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_180 = "";
        local_198 = &boost::unit_test::basic_cstring<char_const>::null;
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x165);
        mc2.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
        mc2.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
        mc2.matrix_.super_Matrix_dimension_option.dimensions_.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x209297;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = CStack_730.matrix_._M_h._M_bucket_count;
        uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar4,0);
        if (CStack_730.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
          p_Var2 = CStack_730.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
          uVar1 = *(uint *)&p_Var2[1]._M_nxt;
          do {
            if (uVar1 == 6) {
              local_860 = (char *)CONCAT44(local_860._4_4_,*(int *)&p_Var2[2]._M_nxt);
              local_870 = (undefined4 **)CONCAT44(local_870._4_4_,2);
              local_828.colSettings_ =
                   (Column_settings *)
                   CONCAT71(local_828.colSettings_._1_7_,*(int *)&p_Var2[2]._M_nxt == 2);
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_8b8 = (undefined4 ****)0x209319;
              local_8b0 = "";
              local_890 = (undefined **)&local_860;
              mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mr.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
              mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              local_848 = &local_870;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_848;
              mr.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_890;
              boost::test_tools::tt_detail::report_assertion
                        (&local_828,&mc2,&local_8b8,0x165,1,2,2,"mb.get_column_dimension(6)",&mr,"2"
                         ,&mc1);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)
                         ((long)&local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8));
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              mc1.colSettings_ = (Column_settings *)birth_comp;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_invoke;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_manager;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              mc2.colSettings_ = (Column_settings *)death_comp;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_invoke;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)std::
                            _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
                            ::_M_manager;
              mr.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mr.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
              ::
              Chain_matrix<std::function<bool(unsigned_int,unsigned_int)>,std::function<bool(unsigned_int,unsigned_int)>>
                        ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
                          *)&mr.matrix_,5,mr.colSettings_,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
                         (function<bool_(unsigned_int,_unsigned_int)> *)&mc2);
              if (mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish)(&mc2,&mc2,3);
              }
              if (mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish != (pointer)0x0) {
                (*(code *)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish)(&mc1,&mc1,3);
              }
              local_1a8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1a0 = "";
              local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x169);
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              local_828.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fee0;
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x209297;
              local_870 = (undefined4 **)
                          CONCAT44(local_870._4_4_,(int)mr.matrix_.matrix_._M_h._M_element_count);
              local_860 = (char *)&local_8c8;
              local_8b8 = (undefined4 ****)
                          CONCAT71(local_8b8._1_7_,
                                   (int)mr.matrix_.matrix_._M_h._M_element_count == 0);
              local_8c8 = (int *)((ulong)local_8c8._4_4_ << 0x20);
              local_8b0 = (char *)0x0;
              sStack_8a8.pi_ = (sp_counted_base *)0x0;
              local_890 = (undefined **)0x209319;
              local_888 = "";
              local_848 = &local_870;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mc1.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fe50;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              mc1.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_848;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)mc2.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              mc2.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              mc2.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_860;
              boost::test_tools::tt_detail::report_assertion
                        (&local_8b8,&local_828,&local_890,0x169,1,2,2,"mr.get_number_of_columns()",
                         &mc1,"0",&mc2);
              boost::detail::shared_count::~shared_count(&sStack_8a8);
              mc1.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc1.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
              ::Chain_matrix(&mc1.matrix_,
                             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                              *)(local_738 + 8),mc1.colSettings_);
              mc2.colSettings_ = (Column_settings *)operator_new(0x38);
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.
              super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
              ((mc2.colSettings_)->entryConstructor).entryPool_.
              super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
              Gudhi::persistence_matrix::
              Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
              ::Chain_matrix(&mc2.matrix_,
                             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                              *)(local_738 + 8),mc2.colSettings_);
              local_1c8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1c0 = "";
              local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x16e);
              local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
              local_890 = &PTR__lazy_ostream_0024fee0;
              local_880 = &boost::unit_test::lazy_ostream::inst;
              local_878 = (undefined4 **)0x209297;
              local_870 = &local_8c0;
              local_8c8 = &local_8cc;
              local_8cc = 7;
              local_840 = 0;
              sStack_838.pi_ = (sp_counted_base *)0x0;
              local_860 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_858 = "";
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
              local_828.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fe50;
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&boost::unit_test::lazy_ostream::inst;
              local_828.matrix_.super_Matrix_dimension_option.dimensions_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&local_870;
              local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
              local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
              sStack_8a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
              local_8a0 = &local_8c8;
              local_848._0_1_ = (int)mc1.matrix_.matrix_._M_h._M_element_count == 7;
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_838);
              local_1e8 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_1e0 = "";
              local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x16f);
              local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
              local_890 = &PTR__lazy_ostream_0024fee0;
              local_880 = &boost::unit_test::lazy_ostream::inst;
              local_878 = (undefined4 **)0x209297;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
              uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
              if (mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
              {
                p_Var2 = mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                do {
                  if (uVar1 == 2) {
                    local_8c0._0_4_ = *(int *)&p_Var2[2]._M_nxt;
                    local_8cc = 0;
                    local_848._0_1_ = (int)local_8c0 == 0;
                    local_840 = 0;
                    sStack_838.pi_ = (sp_counted_base *)0x0;
                    local_860 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_858 = "";
                    local_870 = &local_8c0;
                    local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         (pointer)((ulong)local_828.matrix_.super_Matrix_dimension_option.
                                          dimensions_.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start &
                                  0xffffffffffffff00);
                    local_828.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
                    local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         (pointer)&boost::unit_test::lazy_ostream::inst;
                    local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)&local_870;
                    local_8c8 = &local_8cc;
                    local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
                    local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                    sStack_8a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                    local_8a0 = &local_8c8;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_848,&local_890,&local_860,0x16f,1,2,2,
                               "mc1.get_column_dimension(2)",&local_828,"0",&local_8b8);
                    boost::detail::shared_count::~shared_count(&sStack_838);
                    local_208 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_200 = "";
                    local_218 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_210 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,
                               0x170);
                    local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
                    local_890 = &PTR__lazy_ostream_0024fee0;
                    local_880 = &boost::unit_test::lazy_ostream::inst;
                    local_878 = (undefined4 **)0x209297;
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = mc1.matrix_.matrix_._M_h._M_bucket_count;
                    uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar6,0);
                    if (mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var2 = mc1.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->_M_nxt;
                      uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                      do {
                        if (uVar1 == 6) {
                          local_8c0._0_4_ = *(int *)&p_Var2[2]._M_nxt;
                          local_8cc = 2;
                          local_848._0_1_ = (int)local_8c0 == 2;
                          local_840 = 0;
                          sStack_838.pi_ = (sp_counted_base *)0x0;
                          local_860 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_858 = "";
                          local_870 = &local_8c0;
                          local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               (pointer)((ulong)local_828.matrix_.super_Matrix_dimension_option.
                                                dimensions_.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start &
                                        0xffffffffffffff00);
                          local_828.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fea0;
                          local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               (pointer)&boost::unit_test::lazy_ostream::inst;
                          local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)&local_870;
                          local_8c8 = &local_8cc;
                          local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
                          local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                          sStack_8a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_8a0 = &local_8c8;
                          boost::test_tools::tt_detail::report_assertion
                                    (&local_848,&local_890,&local_860,0x170,1,2,2,
                                     "mc1.get_column_dimension(6)",&local_828,"2",&local_8b8);
                          boost::detail::shared_count::~shared_count(&sStack_838);
                          local_228 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_220 = "";
                          local_238 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_230 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_228,0x171);
                          local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
                          local_890 = &PTR__lazy_ostream_0024fee0;
                          local_880 = &boost::unit_test::lazy_ostream::inst;
                          local_878 = (undefined4 **)0x209297;
                          local_848._0_1_ = (int)mc2.matrix_.matrix_._M_h._M_element_count == 7;
                          local_8cc = 7;
                          local_840 = 0;
                          sStack_838.pi_ = (sp_counted_base *)0x0;
                          local_860 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_858 = "";
                          local_870 = &local_8c0;
                          local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start =
                               (pointer)((ulong)local_828.matrix_.super_Matrix_dimension_option.
                                                dimensions_.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start &
                                        0xffffffffffffff00);
                          local_828.colSettings_ = (Column_settings *)&PTR__lazy_ostream_0024fe50;
                          local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               (pointer)&boost::unit_test::lazy_ostream::inst;
                          local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage = (pointer)&local_870;
                          local_8c8 = &local_8cc;
                          local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
                          local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                          sStack_8a8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                          local_8a0 = &local_8c8;
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_838);
                          local_248 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_240 = "";
                          local_258 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_250 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_248,0x172);
                          local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
                          local_890 = &PTR__lazy_ostream_0024fee0;
                          local_880 = &boost::unit_test::lazy_ostream::inst;
                          local_878 = (undefined4 **)0x209297;
                          auVar7._8_8_ = 0;
                          auVar7._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                          uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar7,0);
                          if (mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                              (__node_base_ptr)0x0) {
                            p_Var2 = mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]->
                                     _M_nxt;
                            uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                            do {
                              if (uVar1 == 2) {
                                local_8c0._0_4_ = *(int *)&p_Var2[2]._M_nxt;
                                local_8cc = 0;
                                local_848._0_1_ = (int)local_8c0 == 0;
                                local_840 = 0;
                                sStack_838.pi_ = (sp_counted_base *)0x0;
                                local_860 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_858 = "";
                                local_870 = &local_8c0;
                                local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)((ulong)local_828.matrix_.
                                                      super_Matrix_dimension_option.dimensions_.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                              0xffffffffffffff00);
                                local_828.colSettings_ =
                                     (Column_settings *)&PTR__lazy_ostream_0024fea0;
                                local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     (pointer)&boost::unit_test::lazy_ostream::inst;
                                local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage =
                                     (pointer)&local_870;
                                local_8c8 = &local_8cc;
                                local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
                                local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                                sStack_8a8.pi_ =
                                     (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                local_8a0 = &local_8c8;
                                boost::test_tools::tt_detail::report_assertion
                                          (&local_848,&local_890,&local_860,0x172,1,2,2,
                                           "mc2.get_column_dimension(2)",&local_828,"0",&local_8b8);
                                boost::detail::shared_count::~shared_count(&sStack_838);
                                local_268 = 
                                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                ;
                                local_260 = "";
                                local_278 = &boost::unit_test::basic_cstring<char_const>::null;
                                local_270 = &boost::unit_test::basic_cstring<char_const>::null;
                                boost::unit_test::unit_test_log_t::set_checkpoint
                                          (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                           &local_268,0x173);
                                local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
                                local_890 = &PTR__lazy_ostream_0024fee0;
                                local_880 = &boost::unit_test::lazy_ostream::inst;
                                local_878 = (undefined4 **)0x209297;
                                auVar8._8_8_ = 0;
                                auVar8._0_8_ = mc2.matrix_.matrix_._M_h._M_bucket_count;
                                uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) % auVar8,0);
                                if (mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff] !=
                                    (__node_base_ptr)0x0) {
                                  p_Var2 = mc2.matrix_.matrix_._M_h._M_buckets[uVar14 & 0xffffffff]
                                           ->_M_nxt;
                                  uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                  do {
                                    if (uVar1 == 6) {
                                      local_8c0 = (undefined4 *)
                                                  CONCAT44(local_8c0._4_4_,*(int *)&p_Var2[2]._M_nxt
                                                          );
                                      local_8cc = 2;
                                      local_848 = (undefined4 ***)
                                                  CONCAT71(local_848._1_7_,
                                                           *(int *)&p_Var2[2]._M_nxt == 2);
                                      local_840 = 0;
                                      sStack_838.pi_ = (sp_counted_base *)0x0;
                                      local_860 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_858 = "";
                                      local_870 = &local_8c0;
                                      local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           (pointer)((ulong)local_828.matrix_.
                                                            super_Matrix_dimension_option.
                                                            dimensions_.
                                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0xffffffffffffff00);
                                      local_828.colSettings_ =
                                           (Column_settings *)&PTR__lazy_ostream_0024fea0;
                                      local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           (pointer)&boost::unit_test::lazy_ostream::inst;
                                      local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)&local_870;
                                      local_8c8 = &local_8cc;
                                      local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
                                      local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0;
                                      sStack_8a8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_8a0 = &local_8c8;
                                      boost::test_tools::tt_detail::report_assertion
                                                (&local_848,&local_890,&local_860,0x173,1,2,2,
                                                 "mc2.get_column_dimension(6)",&local_828,"2",
                                                 &local_8b8);
                                      boost::detail::shared_count::~shared_count(&sStack_838);
                                      local_828.matrix_.super_Matrix_dimension_option.maxDim_ =
                                           CStack_730.super_Matrix_dimension_option.maxDim_;
                                      local_828.colSettings_ = (Column_settings *)local_738;
                                      local_738 = (undefined1  [8])0x0;
                                      local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start =
                                           CStack_730.super_Matrix_dimension_option.dimensions_.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                      local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish =
                                           CStack_730.super_Matrix_dimension_option.dimensions_.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                                      local_828.matrix_.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           CStack_730.super_Matrix_dimension_option.dimensions_.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                      CStack_730.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                           (pointer)0x0;
                                      CStack_730.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                      CStack_730.super_Matrix_dimension_option.dimensions_.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                      CStack_730.super_Matrix_dimension_option.maxDim_ = -1;
                                      local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._M_unused._M_object =
                                           (void *)0x0;
                                      local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_functor._8_8_ = 0;
                                      local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      super__Function_base._M_manager = (_Manager_type)0x0;
                                      local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                      _M_invoker = CStack_730.super_Chain_vine_swap_option.
                                                   birthComp_._M_invoker;
                                      if (CStack_730.super_Chain_vine_swap_option.birthComp_.
                                          super__Function_base._M_manager != (_Manager_type)0x0) {
                                        local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_functor._M_unused._M_object =
                                             CStack_730.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_functor._M_unused._M_object;
                                        local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_functor._8_8_ =
                                             CStack_730.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_functor._8_8_;
                                        local_828.matrix_.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_manager =
                                             CStack_730.super_Chain_vine_swap_option.birthComp_.
                                             super__Function_base._M_manager;
                                        CStack_730.super_Chain_vine_swap_option.birthComp_.
                                        super__Function_base._M_manager = (_Manager_type)0x0;
                                        CStack_730.super_Chain_vine_swap_option.birthComp_.
                                        _M_invoker = (_Invoker_type)0x0;
                                      }
                                      local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_functor._M_unused._M_object =
                                           (void *)0x0;
                                      local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_functor._8_8_ = 0;
                                      local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      super__Function_base._M_manager = (_Manager_type)0x0;
                                      local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                      _M_invoker = CStack_730.super_Chain_vine_swap_option.
                                                   deathComp_._M_invoker;
                                      if (CStack_730.super_Chain_vine_swap_option.deathComp_.
                                          super__Function_base._M_manager != (_Manager_type)0x0) {
                                        local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._4_4_ =
                                             CStack_730.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._4_4_;
                                        local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._0_4_ =
                                             CStack_730.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._0_4_;
                                        local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._12_4_ =
                                             CStack_730.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._12_4_;
                                        local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_functor._8_4_ =
                                             CStack_730.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_functor._8_4_;
                                        local_828.matrix_.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_manager =
                                             CStack_730.super_Chain_vine_swap_option.deathComp_.
                                             super__Function_base._M_manager;
                                        CStack_730.super_Chain_vine_swap_option.deathComp_.
                                        super__Function_base._M_manager = (_Manager_type)0x0;
                                        CStack_730.super_Chain_vine_swap_option.deathComp_.
                                        _M_invoker = (_Invoker_type)0x0;
                                      }
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&local_828.matrix_.matrix_._M_h,local_738 + 0x68)
                                      ;
                                      std::
                                      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                      ::_Hashtable(&local_828.matrix_.pivotToColumnIndex_._M_h,
                                                   local_738 + 0xa0);
                                      local_828.matrix_.colSettings_ = CStack_730.colSettings_;
                                      local_828.matrix_.nextIndex_ = CStack_730.nextIndex_;
                                      CStack_730.nextIndex_ = 0;
                                      CStack_730.colSettings_ = (Column_settings *)0x0;
                                      local_288 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_280 = "";
                                      local_298 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_290 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_288,0x177);
                                      local_840 = local_840 & 0xffffffffffffff00;
                                      local_848 = (undefined4 ***)&PTR__lazy_ostream_0024fee0;
                                      sStack_838.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_830 = "";
                                      local_8cc = (int)local_828.matrix_.matrix_._M_h.
                                                       _M_element_count;
                                      local_894 = 7;
                                      local_858 = (char *)0x0;
                                      sStack_850.pi_ = (sp_counted_base *)0x0;
                                      local_870 = (undefined4 **)0x209319;
                                      local_868 = "";
                                      local_8c8 = &local_8cc;
                                      local_8b0 = (char *)((ulong)local_8b0 & 0xffffffffffffff00);
                                      local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fe50;
                                      sStack_8a8.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_8a0 = &local_8c8;
                                      local_888 = (char *)((ulong)local_888 & 0xffffffffffffff00);
                                      local_890 = &PTR__lazy_ostream_0024fea0;
                                      local_880 = &boost::unit_test::lazy_ostream::inst;
                                      local_878 = &local_8c0;
                                      local_8c0 = &local_894;
                                      local_860._0_1_ =
                                           (int)local_828.matrix_.matrix_._M_h._M_element_count == 7
                                      ;
                                      boost::test_tools::tt_detail::report_assertion();
                                      boost::detail::shared_count::~shared_count(&sStack_850);
                                      local_2a8 = 
                                      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                      ;
                                      local_2a0 = "";
                                      local_2b8 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null
                                      ;
                                      boost::unit_test::unit_test_log_t::set_checkpoint
                                                (boost::unit_test::(anonymous_namespace)::
                                                 unit_test_log,&local_2a8,0x178);
                                      local_840 = local_840 & 0xffffffffffffff00;
                                      local_848 = (undefined4 ***)&PTR__lazy_ostream_0024fee0;
                                      sStack_838.pi_ =
                                           (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
                                      local_830 = "";
                                      auVar9._8_8_ = 0;
                                      auVar9._0_8_ = local_828.matrix_.matrix_._M_h._M_bucket_count;
                                      uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar9,0);
                                      if (local_828.matrix_.matrix_._M_h._M_buckets
                                          [uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
                                        p_Var2 = local_828.matrix_.matrix_._M_h._M_buckets
                                                 [uVar14 & 0xffffffff]->_M_nxt;
                                        uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                        do {
                                          if (uVar1 == 2) {
                                            local_8cc = *(int *)&p_Var2[2]._M_nxt;
                                            local_894 = 0;
                                            local_860._0_1_ = local_8cc == 0;
                                            local_858 = (char *)0x0;
                                            sStack_850.pi_ = (sp_counted_base *)0x0;
                                            local_870 = (undefined4 **)0x209319;
                                            local_868 = "";
                                            local_8c8 = &local_8cc;
                                            local_8b0 = (char *)((ulong)local_8b0 &
                                                                0xffffffffffffff00);
                                            local_8b8 = (undefined4 ****)&PTR__lazy_ostream_0024fea0
                                            ;
                                            sStack_8a8.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_8a0 = &local_8c8;
                                            local_888 = (char *)((ulong)local_888 &
                                                                0xffffffffffffff00);
                                            local_890 = &PTR__lazy_ostream_0024fea0;
                                            local_880 = &boost::unit_test::lazy_ostream::inst;
                                            local_878 = &local_8c0;
                                            local_8c0 = &local_894;
                                            boost::test_tools::tt_detail::report_assertion
                                                      (&local_860,&local_848,&local_870,0x178,1,2,2,
                                                       "mm.get_column_dimension(2)",&local_8b8,"0",
                                                       &local_890);
                                            boost::detail::shared_count::~shared_count(&sStack_850);
                                            local_2c8 = 
                                            "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                            ;
                                            local_2c0 = "";
                                            local_2d8 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            local_2d0 = &boost::unit_test::basic_cstring<char_const>
                                                         ::null;
                                            boost::unit_test::unit_test_log_t::set_checkpoint
                                                      (boost::unit_test::(anonymous_namespace)::
                                                       unit_test_log,&local_2c8,0x179);
                                            local_840 = local_840 & 0xffffffffffffff00;
                                            local_848 = (undefined4 ***)&PTR__lazy_ostream_0024fee0;
                                            sStack_838.pi_ =
                                                 (sp_counted_base *)
                                                 &boost::unit_test::lazy_ostream::inst;
                                            local_830 = "";
                                            auVar10._8_8_ = 0;
                                            auVar10._0_8_ =
                                                 local_828.matrix_.matrix_._M_h._M_bucket_count;
                                            uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6)) %
                                                            auVar10,0);
                                            if (local_828.matrix_.matrix_._M_h._M_buckets
                                                [uVar14 & 0xffffffff] != (__node_base_ptr)0x0) {
                                              p_Var2 = local_828.matrix_.matrix_._M_h._M_buckets
                                                       [uVar14 & 0xffffffff]->_M_nxt;
                                              uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                              do {
                                                if (uVar1 == 6) {
                                                  local_8cc = *(int *)&p_Var2[2]._M_nxt;
                                                  local_894 = 2;
                                                  local_860._0_1_ = local_8cc == 2;
                                                  local_858 = (char *)0x0;
                                                  sStack_850.pi_ = (sp_counted_base *)0x0;
                                                  local_870 = (undefined4 **)0x209319;
                                                  local_868 = "";
                                                  local_8c8 = &local_8cc;
                                                  local_8b0 = (char *)((ulong)local_8b0 &
                                                                      0xffffffffffffff00);
                                                  local_8b8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fea0;
                                                  sStack_8a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8a0 = &local_8c8;
                                                  local_888 = (char *)((ulong)local_888 &
                                                                      0xffffffffffffff00);
                                                  local_890 = &PTR__lazy_ostream_0024fea0;
                                                  local_880 = &boost::unit_test::lazy_ostream::inst;
                                                  local_878 = &local_8c0;
                                                  local_8c0 = &local_894;
                                                  boost::test_tools::tt_detail::report_assertion
                                                            (&local_860,&local_848,&local_870,0x179,
                                                             1,2,2,"mm.get_column_dimension(6)",
                                                             &local_8b8,"2",&local_890);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_850);
                                                  local_2e8 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_2e0 = "";
                                                  local_2f8 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_2f0 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_2e8,0x17a);
                                                  local_840 = local_840 & 0xffffffffffffff00;
                                                  local_848 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_838.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_830 = "";
                                                  local_8cc = (int)CStack_730.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_860._0_1_ =
                                                       (int)CStack_730.matrix_._M_h._M_element_count
                                                       == 0;
                                                  local_894 = 0;
                                                  local_858 = (char *)0x0;
                                                  sStack_850.pi_ = (sp_counted_base *)0x0;
                                                  local_870 = (undefined4 **)0x209319;
                                                  local_868 = "";
                                                  local_8c8 = &local_8cc;
                                                  local_8b0 = (char *)((ulong)local_8b0 &
                                                                      0xffffffffffffff00);
                                                  local_8b8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fe50;
                                                  sStack_8a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8a0 = &local_8c8;
                                                  local_888 = (char *)((ulong)local_888 &
                                                                      0xffffffffffffff00);
                                                  local_890 = &PTR__lazy_ostream_0024fea0;
                                                  local_880 = &boost::unit_test::lazy_ostream::inst;
                                                  local_878 = &local_8c0;
                                                  local_8c0 = &local_894;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_850);
                                                  Gudhi::persistence_matrix::swap
                                                            (&local_828.matrix_,
                                                             (
                                                  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                                                  *)(local_738 + 8));
                                                  pCVar13 = local_828.colSettings_;
                                                  local_828.colSettings_ =
                                                       (Column_settings *)local_738;
                                                  local_738 = (undefined1  [8])pCVar13;
                                                  local_308 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_300 = "";
                                                  local_318 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_310 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_308,0x17e);
                                                  local_840 = local_840 & 0xffffffffffffff00;
                                                  local_848 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_838.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_830 = "";
                                                  local_8cc = (int)local_828.matrix_.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_860._0_1_ =
                                                       (int)local_828.matrix_.matrix_._M_h.
                                                            _M_element_count == 0;
                                                  local_894 = 0;
                                                  local_858 = (char *)0x0;
                                                  sStack_850.pi_ = (sp_counted_base *)0x0;
                                                  local_870 = (undefined4 **)0x209319;
                                                  local_868 = "";
                                                  local_8c8 = &local_8cc;
                                                  local_8b0 = (char *)((ulong)local_8b0 &
                                                                      0xffffffffffffff00);
                                                  local_8b8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fe50;
                                                  sStack_8a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8a0 = &local_8c8;
                                                  local_888 = (char *)((ulong)local_888 &
                                                                      0xffffffffffffff00);
                                                  local_890 = &PTR__lazy_ostream_0024fea0;
                                                  local_880 = &boost::unit_test::lazy_ostream::inst;
                                                  local_878 = &local_8c0;
                                                  local_8c0 = &local_894;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_850);
                                                  local_328 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_320 = "";
                                                  local_338 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_330 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_328,0x17f);
                                                  local_840 = local_840 & 0xffffffffffffff00;
                                                  local_848 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_838.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_830 = "";
                                                  local_8cc = (int)CStack_730.matrix_._M_h.
                                                                   _M_element_count;
                                                  local_860._0_1_ =
                                                       (int)CStack_730.matrix_._M_h._M_element_count
                                                       == 7;
                                                  local_894 = 7;
                                                  local_858 = (char *)0x0;
                                                  sStack_850.pi_ = (sp_counted_base *)0x0;
                                                  local_870 = (undefined4 **)0x209319;
                                                  local_868 = "";
                                                  local_8c8 = &local_8cc;
                                                  local_8b0 = (char *)((ulong)local_8b0 &
                                                                      0xffffffffffffff00);
                                                  local_8b8 = (undefined4 ****)
                                                              &PTR__lazy_ostream_0024fe50;
                                                  sStack_8a8.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_8a0 = &local_8c8;
                                                  local_888 = (char *)((ulong)local_888 &
                                                                      0xffffffffffffff00);
                                                  local_890 = &PTR__lazy_ostream_0024fea0;
                                                  local_880 = &boost::unit_test::lazy_ostream::inst;
                                                  local_878 = &local_8c0;
                                                  local_8c0 = &local_894;
                                                  boost::test_tools::tt_detail::report_assertion();
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_850);
                                                  local_348 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_340 = "";
                                                  local_358 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  local_350 = &boost::unit_test::
                                                               basic_cstring<char_const>::null;
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_348,0x180);
                                                  local_840 = local_840 & 0xffffffffffffff00;
                                                  local_848 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_838.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_830 = "";
                                                  auVar11._8_8_ = 0;
                                                  auVar11._0_8_ =
                                                       CStack_730.matrix_._M_h._M_bucket_count;
                                                  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2))
                                                                  % auVar11,0);
                                                  if (CStack_730.matrix_._M_h._M_buckets
                                                      [uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var2 = CStack_730.matrix_._M_h._M_buckets
                                                             [uVar14 & 0xffffffff]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 2) {
                                                        local_8cc = *(int *)&p_Var2[2]._M_nxt;
                                                        local_894 = 0;
                                                        local_860._0_1_ = local_8cc == 0;
                                                        local_858 = (char *)0x0;
                                                        sStack_850.pi_ = (sp_counted_base *)0x0;
                                                        local_870 = (undefined4 **)0x209319;
                                                        local_868 = "";
                                                        local_8c8 = &local_8cc;
                                                        local_8b0 = (char *)((ulong)local_8b0 &
                                                                            0xffffffffffffff00);
                                                        local_8b8 = (undefined4 ****)
                                                                    &PTR__lazy_ostream_0024fea0;
                                                        sStack_8a8.pi_ =
                                                             (sp_counted_base *)
                                                             &boost::unit_test::lazy_ostream::inst;
                                                        local_8a0 = &local_8c8;
                                                        local_888 = (char *)((ulong)local_888 &
                                                                            0xffffffffffffff00);
                                                        local_890 = &PTR__lazy_ostream_0024fea0;
                                                        local_880 = &boost::unit_test::lazy_ostream
                                                                     ::inst;
                                                        local_878 = &local_8c0;
                                                        local_8c0 = &local_894;
                                                        boost::test_tools::tt_detail::
                                                        report_assertion(&local_860,&local_848,
                                                                         &local_870,0x180,1,2,2,
                                                                                                                                                  
                                                  "mb.get_column_dimension(2)",&local_8b8,"0",
                                                  &local_890);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_850);
                                                  local_368 = 
                                                  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                                                  ;
                                                  local_360 = "";
                                                  boost::unit_test::unit_test_log_t::set_checkpoint
                                                            (boost::unit_test::(anonymous_namespace)
                                                             ::unit_test_log,&local_368,0x181);
                                                  local_840 = local_840 & 0xffffffffffffff00;
                                                  local_848 = (undefined4 ***)
                                                              &PTR__lazy_ostream_0024fee0;
                                                  sStack_838.pi_ =
                                                       (sp_counted_base *)
                                                       &boost::unit_test::lazy_ostream::inst;
                                                  local_830 = "";
                                                  auVar12._8_8_ = 0;
                                                  auVar12._0_8_ =
                                                       CStack_730.matrix_._M_h._M_bucket_count;
                                                  uVar14 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(6))
                                                                  % auVar12,0);
                                                  if (CStack_730.matrix_._M_h._M_buckets
                                                      [uVar14 & 0xffffffff] != (__node_base_ptr)0x0)
                                                  {
                                                    p_Var2 = CStack_730.matrix_._M_h._M_buckets
                                                             [uVar14 & 0xffffffff]->_M_nxt;
                                                    uVar1 = *(uint *)&p_Var2[1]._M_nxt;
                                                    do {
                                                      if (uVar1 == 6) {
                                                        local_8cc = *(int *)&p_Var2[2]._M_nxt;
                                                        local_894 = 2;
                                                        local_860 = (char *)CONCAT71(local_860._1_7_
                                                                                     ,local_8cc == 2
                                                                                    );
                                                        local_858 = (char *)0x0;
                                                        sStack_850.pi_ = (sp_counted_base *)0x0;
                                                        local_870 = (undefined4 **)0x209319;
                                                        local_868 = "";
                                                        local_8c8 = &local_8cc;
                                                        local_8b0 = (char *)((ulong)local_8b0 &
                                                                            0xffffffffffffff00);
                                                        local_8b8 = (undefined4 ****)
                                                                    &PTR__lazy_ostream_0024fea0;
                                                        sStack_8a8.pi_ =
                                                             (sp_counted_base *)
                                                             &boost::unit_test::lazy_ostream::inst;
                                                        local_8a0 = &local_8c8;
                                                        local_888 = (char *)((ulong)local_888 &
                                                                            0xffffffffffffff00);
                                                        local_890 = &PTR__lazy_ostream_0024fea0;
                                                        local_880 = &boost::unit_test::lazy_ostream
                                                                     ::inst;
                                                        local_878 = &local_8c0;
                                                        local_8c0 = &local_894;
                                                        boost::test_tools::tt_detail::
                                                        report_assertion(&local_860,&local_848,
                                                                         &local_870,0x181,1,2,2,
                                                                                                                                                  
                                                  "mb.get_column_dimension(6)",&local_8b8,"2",
                                                  &local_890);
                                                  boost::detail::shared_count::~shared_count
                                                            (&sStack_850);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  ::~Matrix(&local_828);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  ::~Matrix(&mc2);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  ::~Matrix(&mc1);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  ::~Matrix(&mr);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  ::~Matrix((
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  *)local_738);
                                                  Gudhi::persistence_matrix::
                                                  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>
                                                  ::~Matrix(&m);
                                                  std::
                                                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                  ::~vector(&ordered_boundaries);
                                                  return;
                                                  }
                                                  p_Var2 = p_Var2->_M_nxt;
                                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          CStack_730.matrix_._M_h._M_bucket_count ==
                                                          uVar14));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                  }
                                                  p_Var2 = p_Var2->_M_nxt;
                                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                          (ulong)uVar1 %
                                                          CStack_730.matrix_._M_h._M_bucket_count ==
                                                          uVar14));
                                                  }
                                                  std::__throw_out_of_range("_Map_base::at");
                                                }
                                                p_Var2 = p_Var2->_M_nxt;
                                              } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                      (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                      (ulong)uVar1 %
                                                      local_828.matrix_.matrix_._M_h._M_bucket_count
                                                      == uVar14));
                                            }
                                            std::__throw_out_of_range("_Map_base::at");
                                          }
                                          p_Var2 = p_Var2->_M_nxt;
                                        } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                                (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                                (ulong)uVar1 %
                                                local_828.matrix_.matrix_._M_h._M_bucket_count ==
                                                uVar14));
                                      }
                                      std::__throw_out_of_range("_Map_base::at");
                                    }
                                    p_Var2 = p_Var2->_M_nxt;
                                  } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                          (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                          (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                          uVar14));
                                }
                                std::__throw_out_of_range("_Map_base::at");
                              }
                              p_Var2 = p_Var2->_M_nxt;
                            } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                                    (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                                    (ulong)uVar1 % mc2.matrix_.matrix_._M_h._M_bucket_count ==
                                    uVar14));
                          }
                          std::__throw_out_of_range("_Map_base::at");
                        }
                        p_Var2 = p_Var2->_M_nxt;
                      } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                              (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                              (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar14));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var2 = p_Var2->_M_nxt;
                } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                        (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                        (ulong)uVar1 % mc1.matrix_.matrix_._M_h._M_bucket_count == uVar14));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var2 = p_Var2->_M_nxt;
          } while ((p_Var2 != (_Hash_node_base *)0x0) &&
                  (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
                  (ulong)uVar1 % CStack_730.matrix_._M_h._M_bucket_count == uVar14));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var2 = p_Var2->_M_nxt;
    } while ((p_Var2 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var2[1]._M_nxt,
            (ulong)uVar1 % CStack_730.matrix_._M_h._M_bucket_count == uVar14));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}